

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ExceptionOr<kj::Promise<unsigned_long>_>::~ExceptionOr
          (ExceptionOr<kj::Promise<unsigned_long>_> *this)

{
  NullableValue<kj::Promise<unsigned_long>_>::~NullableValue(&(this->value).ptr);
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)this);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}